

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O1

Literal * __thiscall
wasm::ShellExternalInterface::tableLoad
          (Literal *__return_storage_ptr__,ShellExternalInterface *this,Name tableName,Address index
          )

{
  __node_base_ptr p_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  undefined1 local_38 [8];
  Name tableName_local;
  
  tableName_local.super_IString.str._M_len = tableName.super_IString.str._M_str;
  local_38 = tableName.super_IString.str._M_len;
  p_Var3 = (_Hash_node_base *)0x0;
  p_Var1 = std::
           _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->tables)._M_h,
                      tableName_local.super_IString.str._M_len % (this->tables)._M_h._M_bucket_count
                      ,(key_type *)local_38,tableName_local.super_IString.str._M_len);
  if (p_Var1 != (__node_base_ptr)0x0) {
    p_Var3 = p_Var1->_M_nxt;
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])
              (this,"tableGet on non-existing table");
  }
  uVar2 = ((long)p_Var3[4]._M_nxt - (long)p_Var3[3]._M_nxt >> 3) * -0x5555555555555555;
  if (uVar2 < index.addr || uVar2 - index.addr == 0) {
    (*(this->super_ExternalInterface)._vptr_ExternalInterface[8])(this,"out of bounds table access")
    ;
  }
  wasm::Literal::Literal(__return_storage_ptr__,(Literal *)(p_Var3[3]._M_nxt + index.addr * 3));
  return __return_storage_ptr__;
}

Assistant:

Literal tableLoad(Name tableName, Address index) override {
    auto it = tables.find(tableName);
    if (it == tables.end()) {
      trap("tableGet on non-existing table");
    }

    auto& table = it->second;
    if (index >= table.size()) {
      trap("out of bounds table access");
    }

    return table[index];
  }